

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::DeferDeserializeFunctionInfo::DeferDeserializeFunctionInfo
          (DeferDeserializeFunctionInfo *this,int nestedCount,LocalFunctionId functionId,
          ByteCodeCache *byteCodeCache,byte *serializedFunction,Utf8SourceInfo *sourceInfo,
          ScriptContext *scriptContext,uint functionNumber,char16 *displayName,
          uint displayNameLength,uint displayShortNameOffset,NativeModule *nativeModule,
          Attributes attributes)

{
  Type *addr;
  Type *addr_00;
  Type *addr_01;
  Recycler *pRVar1;
  FunctionInfo *this_00;
  ProxyEntryPointInfo *this_01;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  (this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014da470;
  (this->super_FunctionProxy).auxPtrs.ptr =
       (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0;
  (this->super_FunctionProxy).functionInfo.ptr = (FunctionInfo *)0x0;
  (this->super_FunctionProxy).m_scriptContext = scriptContext;
  addr = &(this->super_FunctionProxy).m_utf8SourceInfo;
  data._32_8_ = byteCodeCache;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->super_FunctionProxy).m_utf8SourceInfo.ptr = sourceInfo;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  (this->super_FunctionProxy).m_defaultEntryPointInfo.ptr = (ProxyEntryPointInfo *)0x0;
  (this->super_FunctionProxy).deferredPrototypeType.ptr = (ScriptFunctionType *)0x0;
  (this->super_FunctionProxy).undeferredFunctionType.ptr = (ScriptFunctionType *)0x0;
  (this->super_FunctionProxy).m_functionNumber = functionNumber;
  (this->super_FunctionProxy).field_0x44 = ((this->super_FunctionProxy).field_0x44 & 0xd0) + 1;
  (this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014da5a8;
  Memory::Recycler::WBSetBit((char *)&this->m_functionBytes);
  (this->m_functionBytes).ptr = serializedFunction;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_functionBytes);
  Memory::Recycler::WBSetBit((char *)&this->m_cache);
  (this->m_cache).ptr = (ByteCodeCache *)data._32_8_;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_cache);
  (this->m_displayName).ptr = (char16_t *)0x0;
  this->m_displayNameLength = 0;
  Memory::Recycler::WBSetBit((char *)&this->m_nativeModule);
  (this->m_nativeModule).ptr = nativeModule;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_nativeModule);
  local_68 = (undefined1  [8])&FunctionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab02c8;
  data.filename._0_4_ = 0x63e;
  pRVar1 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x387914);
  FunctionInfo::FunctionInfo
            (this_00,JavascriptFunction::DeferredDeserializeThunk,attributes | DeferredDeserialize,
             functionId,&this->super_FunctionProxy);
  addr_00 = &(this->super_FunctionProxy).functionInfo;
  Memory::Recycler::WBSetBit((char *)addr_00);
  (this->super_FunctionProxy).functionInfo.ptr = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  local_68 = (undefined1  [8])&ProxyEntryPointInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab02c8;
  data.filename._0_4_ = 0x63f;
  pRVar1 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
  this_01 = (ProxyEntryPointInfo *)new<Memory::Recycler>(0x18,pRVar1,0x387914);
  ExpirableObject::ExpirableObject((ExpirableObject *)this_01,(ThreadContext *)0x0);
  (this_01->super_ExpirableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014dab68;
  this_01->jsMethod = JavascriptFunction::DeferredDeserializeThunk;
  addr_01 = &(this->super_FunctionProxy).m_defaultEntryPointInfo;
  Memory::Recycler::WBSetBit((char *)addr_01);
  (this->super_FunctionProxy).m_defaultEntryPointInfo.ptr = this_01;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
  (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[6])
            (this,displayName,(ulong)displayNameLength,(ulong)displayShortNameOffset,1);
  return;
}

Assistant:

DeferDeserializeFunctionInfo::DeferDeserializeFunctionInfo(int nestedCount, LocalFunctionId functionId, ByteCodeCache* byteCodeCache, const byte* serializedFunction, Utf8SourceInfo* sourceInfo, ScriptContext* scriptContext, uint functionNumber, const char16* displayName, uint displayNameLength, uint displayShortNameOffset, NativeModule *nativeModule, FunctionInfo::Attributes attributes) :
        FunctionProxy(scriptContext, sourceInfo, functionNumber),
        m_cache(byteCodeCache),
        m_functionBytes(serializedFunction),
        m_displayName(nullptr),
        m_displayNameLength(0),
        m_nativeModule(nativeModule)
    {
        this->functionInfo = RecyclerNew(scriptContext->GetRecycler(), FunctionInfo, DefaultDeferredDeserializeThunk, (FunctionInfo::Attributes)(attributes | FunctionInfo::Attributes::DeferredDeserialize), functionId, this);
        this->m_defaultEntryPointInfo = RecyclerNew(scriptContext->GetRecycler(), ProxyEntryPointInfo, DefaultDeferredDeserializeThunk);
        PERF_COUNTER_INC(Code, DeferDeserializeFunctionProxy);

        SetDisplayName(displayName, displayNameLength, displayShortNameOffset, FunctionProxy::SetDisplayNameFlagsDontCopy);
    }